

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

bool __thiscall cfd::core::Extkey::HasMainnetKey(Extkey *this)

{
  bool bVar1;
  KeyFormatData local_80;
  
  GetKeyFormatFromVersion(&local_80,this->version_);
  bVar1 = KeyFormatData::IsMainnet(&local_80);
  KeyFormatData::~KeyFormatData(&local_80);
  return bVar1;
}

Assistant:

bool Extkey::HasMainnetKey() const {
  return GetKeyFormatFromVersion(version_).IsMainnet();
}